

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_ManCheckTopoOrder(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  
  Gia_ManFillValue(p);
  pGVar2 = p->pObjs;
  pGVar2->Value = 0;
  lVar6 = (long)p->vCis->nSize;
  if (0 < lVar6) {
    piVar3 = p->vCis->pArray;
    lVar8 = 0;
    do {
      iVar1 = piVar3[lVar8];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fd1e8;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar2[iVar1].Value = 0;
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  pVVar5 = p->vCos;
  if (pVVar5->nSize < 1) {
    uVar7 = 1;
  }
  else {
    uVar7 = 1;
    lVar6 = 0;
    do {
      iVar1 = pVVar5->pArray[lVar6];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001fd1e8:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return uVar7;
      }
      pGVar2 = p->pObjs + iVar1;
      uVar4 = Gia_ManCheckTopoOrder_rec
                        (p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
      uVar7 = uVar7 & uVar4;
      lVar6 = lVar6 + 1;
      pVVar5 = p->vCos;
    } while (lVar6 < pVVar5->nSize);
  }
  return uVar7;
}

Assistant:

int Gia_ManCheckTopoOrder( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, RetValue = 1;
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        RetValue &= Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin0(pObj) );
    return RetValue;
}